

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_Z.c
# Opt level: O3

void test_read_format_iso_Z(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  char *pcVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_iso.iso.Z");
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                   ,L'%',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3)
  ;
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  wVar2 = archive_read_open_filename(paVar3,"test_read_format_iso.iso.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'+',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 512)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_file_count(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'.',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'0',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'1',(long)iVar1,"archive_format(a)",0x40000,"ARCHIVE_FORMAT_ISO9660",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'2',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'3',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar3);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  extract_reference_file("test_read_format_iso_2.iso.Z");
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                   ,L'A',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  wVar2 = archive_read_open_filename(paVar3,"test_read_format_iso_2.iso.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'G',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 512)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'J',".","\".\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'M',"A","\"A\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'P',"A/B","\"A/B\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'S',"C","\"C\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
             ,L'V',"C/D","\"C/D\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'X',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_file_count(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'Y',5,"5",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'[',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'\\',(long)iVar1,"archive_format(a)",0x40000,"ARCHIVE_FORMAT_ISO9660",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L']',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'^',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar3);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_iso_Z.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test1(void)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *name = "test_read_format_iso.iso.Z";

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, name, 512));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}